

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

string * __thiscall
LinkedReadsDatastore::get_read_sequence_abi_cxx11_
          (string *__return_storage_ptr__,LinkedReadsDatastore *this,size_t readID)

{
  uint64_t uVar1;
  FILE *pFVar2;
  uint64_t uVar3;
  size_t __n;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sStack_40;
  char acStack_38 [14];
  allocator local_2a;
  allocator local_29;
  
  if ((readID == 0) ||
     ((ulong)((long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 1) < readID)) {
    sStack_40 = 0x1d68ad;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_2a);
  }
  else {
    lVar4 = -(this->readsize + 0x10 & 0xfffffffffffffff0);
    uVar1 = this->readsize;
    pFVar2 = (FILE *)this->fd;
    uVar3 = this->readpos_offset;
    pcVar5 = acStack_38 + lVar4 + -8;
    pcVar5[0] = -0x16;
    pcVar5[1] = 'h';
    pcVar5[2] = '\x1d';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    fseek(pFVar2,(readID - 1) * (uVar1 + 1) + uVar3,0);
    uVar1 = this->readsize;
    pFVar2 = (FILE *)this->fd;
    pcVar6 = acStack_38 + lVar4 + -8;
    pcVar6[0] = '\x01';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    __n = *(size_t *)(acStack_38 + lVar4 + -8);
    pcVar7 = acStack_38 + lVar4 + -8;
    builtin_strncpy(acStack_38 + lVar4 + -8,"\x03i\x1d",4);
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    fread(acStack_38 + lVar4,uVar1 + 1,__n,pFVar2);
    pcVar8 = acStack_38 + lVar4 + -8;
    builtin_strncpy(acStack_38 + lVar4 + -8,"\x12i\x1d",4);
    pcVar8[4] = '\0';
    pcVar8[5] = '\0';
    pcVar8[6] = '\0';
    pcVar8[7] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__,acStack_38 + lVar4,&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinkedReadsDatastore::get_read_sequence(size_t readID) {
    if (readID==0 or readID>size()) return "";
    char buffer[readsize+1];
    size_t read_offset_in_file=readpos_offset+(readsize+1)*(readID-1);
    fseek(fd,read_offset_in_file,SEEK_SET);
    fread(buffer,readsize+1,1,fd);
    return std::string(buffer);
}